

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::ExecuteTask(WindowDistinctAggregatorLocalState *this)

{
  atomic<unsigned_long> *paVar1;
  PartitionSortStage PVar2;
  type state;
  reference this_00;
  type pLVar3;
  MergeSorter merge_sorter;
  MergeSorter MStack_58;
  
  state = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
          operator*(&this->gastate->global_sort);
  PVar2 = this->stage;
  if (PVar2 == SORTED) {
    Sorted(this);
  }
  else if (PVar2 == MERGE) {
    MergeSorter::MergeSorter(&MStack_58,state,state->buffer_manager);
    MergeSorter::PerformInMergeRound(&MStack_58);
    MergeSorter::~MergeSorter(&MStack_58);
  }
  else if (PVar2 == SCAN) {
    this_00 = vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_true>
              ::get<true>(&this->gastate->local_sorts,this->block_idx);
    pLVar3 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>::
             operator*(this_00);
    GlobalSortState::AddLocalState(state,pLVar3);
  }
  LOCK();
  paVar1 = &this->gastate->tasks_completed;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::ExecuteTask() {
	auto &global_sort = *gastate.global_sort;
	switch (stage) {
	case PartitionSortStage::SCAN:
		global_sort.AddLocalState(*gastate.local_sorts[block_idx]);
		break;
	case PartitionSortStage::MERGE: {
		MergeSorter merge_sorter(global_sort, global_sort.buffer_manager);
		merge_sorter.PerformInMergeRound();
		break;
	}
	case PartitionSortStage::SORTED:
		Sorted();
		break;
	default:
		break;
	}

	++gastate.tasks_completed;
}